

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::MultiplyBy
          (BigUnsigned<84> *this,int other_size,uint32_t *other_words)

{
  int *piVar1;
  int local_34;
  int local_30;
  int step;
  int local_28;
  int local_24;
  int first_step;
  int original_size;
  uint32_t *other_words_local;
  BigUnsigned<84> *pBStack_10;
  int other_size_local;
  BigUnsigned<84> *this_local;
  
  local_24 = this->size_;
  step = local_24 + other_size + -2;
  local_30 = 0x53;
  _first_step = other_words;
  other_words_local._4_4_ = other_size;
  pBStack_10 = this;
  piVar1 = std::min<int>(&step,&local_30);
  local_34 = *piVar1;
  local_28 = local_34;
  for (; -1 < local_34; local_34 = local_34 + -1) {
    MultiplyStep(this,local_24,_first_step,other_words_local._4_4_,local_34);
  }
  return;
}

Assistant:

void MultiplyBy(int other_size, const uint32_t* other_words) {
    const int original_size = size_;
    const int first_step =
        (std::min)(original_size + other_size - 2, max_words - 1);
    for (int step = first_step; step >= 0; --step) {
      MultiplyStep(original_size, other_words, other_size, step);
    }
  }